

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O0

char * archive_handle_type_name(uint m)

{
  char *pcStack_10;
  uint m_local;
  
  if (m == 0xb0c5c0de) {
    pcStack_10 = "archive_write";
  }
  else if (m == 0xc001b0c5) {
    pcStack_10 = "archive_write_disk";
  }
  else if (m == 0xdeb0c5) {
    pcStack_10 = "archive_read";
  }
  else if (m == 0xbadb0c5) {
    pcStack_10 = "archive_read_disk";
  }
  else if (m == 0xcad11c9) {
    pcStack_10 = "archive_match";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char *
archive_handle_type_name(unsigned m)
{
	switch (m) {
	case ARCHIVE_WRITE_MAGIC:	return ("archive_write");
	case ARCHIVE_READ_MAGIC:	return ("archive_read");
	case ARCHIVE_WRITE_DISK_MAGIC:	return ("archive_write_disk");
	case ARCHIVE_READ_DISK_MAGIC:	return ("archive_read_disk");
	case ARCHIVE_MATCH_MAGIC:	return ("archive_match");
	default:			return NULL;
	}
}